

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

char * lua_getupvalue(lua_State *L,int funcindex,int n)

{
  StkId pTVar1;
  int iVar2;
  undefined4 uVar3;
  TValue *fi;
  char *pcVar4;
  TValue *val;
  TValue *local_20;
  
  local_20 = (TValue *)0x0;
  fi = index2addr(L,funcindex);
  pcVar4 = aux_upvalue(fi,n,&local_20,(CClosure **)0x0,(UpVal **)0x0);
  if (pcVar4 != (char *)0x0) {
    pTVar1 = L->top;
    iVar2 = local_20->tt_;
    uVar3 = *(undefined4 *)&local_20->field_0xc;
    pTVar1->value_ = local_20->value_;
    pTVar1->tt_ = iVar2;
    *(undefined4 *)&pTVar1->field_0xc = uVar3;
    L->top = L->top + 1;
  }
  return pcVar4;
}

Assistant:

LUA_API const char *lua_getupvalue(lua_State *L, int funcindex, int n) {
    const char *name;
    TValue *val = NULL;  /* to avoid warnings */
    lua_lock(L);
    name = aux_upvalue(index2addr(L, funcindex), n, &val, NULL, NULL);
    if (name) {
        setobj2s(L, L->top, val);
        api_incr_top(L);
    }
    lua_unlock(L);
    return name;
}